

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O0

FFSFormatList ReturnNthListEntry(FFSFormatList List,size_t Count)

{
  size_t Count_local;
  FFSFormatList List_local;
  
  Count_local = Count;
  for (List_local = List; List_local != (FFSFormatList)0x0 && Count_local != 0;
      List_local = List_local->Next) {
    Count_local = Count_local - 1;
  }
  return List_local;
}

Assistant:

static FFSFormatList ReturnNthListEntry(FFSFormatList List, size_t Count)
{
    while (List && Count)
    {
        Count--;
        List = List->Next;
    }
    return List;
}